

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O1

SUNErrCode N_VBufSize_ManyVector(N_Vector x,sunindextype *size)

{
  long in_RAX;
  long *plVar1;
  long lVar2;
  sunindextype subvec_size;
  long local_28;
  
  *size = 0;
  plVar1 = (long *)x->content;
  if (0 < *plVar1) {
    lVar2 = 0;
    local_28 = in_RAX;
    do {
      N_VBufSize(*(undefined8 *)(plVar1[2] + lVar2 * 8),&local_28);
      *size = *size + local_28;
      lVar2 = lVar2 + 1;
      plVar1 = (long *)x->content;
    } while (lVar2 < *plVar1);
  }
  return 0;
}

Assistant:

SUNErrCode MVAPPEND(N_VBufSize)(N_Vector x, sunindextype* size)
{
  SUNFunctionBegin(x->sunctx);
  sunindextype subvec_size; /* subvector buffer size */
  sunindextype i;

  /* initialize total size */
  *size = 0;

  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(x); i++)
  {
    /* get buffer sized needed for this subvector */
    SUNCheckCall(N_VBufSize(MANYVECTOR_SUBVEC(x, i), &subvec_size));

    /* update total buffer size */
    *size += subvec_size;
  }

  return SUN_SUCCESS;
}